

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

EColorRange V_ParseFontColor(BYTE **color_value,int normalcolor,int boldcolor)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  byte *text;
  byte *pbVar4;
  FName local_14;
  
  bVar1 = **color_value;
  text = *color_value + 1;
  uVar2 = (uint)bVar1;
  if (bVar1 < 0x2b) {
    boldcolor = PrintColors[4];
    if ((bVar1 == 0x21) || (boldcolor = PrintColors[3], uVar2 == 0x2a)) goto LAB_00580bca;
  }
  else {
    if ((uVar2 == 0x2b) || (boldcolor = normalcolor, uVar2 == 0x2d)) goto LAB_00580bca;
    if (uVar2 == 0x5b) {
      lVar3 = 0;
      for (pbVar4 = text; (*pbVar4 != 0 && (*pbVar4 != 0x5d)); pbVar4 = pbVar4 + 1) {
        lVar3 = lVar3 + 0x100000000;
      }
      FName::NameManager::FindName(&FName::NameData,(char *)text,lVar3 >> 0x20,true);
      text = pbVar4 + (*pbVar4 != 0);
      boldcolor = V_FindFontColor(&local_14);
      goto LAB_00580bca;
    }
  }
  if ((byte)(bVar1 + 0xbf) < 0x16) {
    boldcolor = uVar2 + 0xffffffbf;
  }
  else if ((byte)(bVar1 + 0x9f) < 0x16) {
    boldcolor = uVar2 + 0xffffff9f;
  }
  else {
    text = text + -(ulong)(*text == 0);
    boldcolor = CR_UNDEFINED;
  }
LAB_00580bca:
  *color_value = text;
  return boldcolor;
}

Assistant:

EColorRange V_ParseFontColor (const BYTE *&color_value, int normalcolor, int boldcolor)
{
	const BYTE *ch = color_value;
	int newcolor = *ch++;

	if (newcolor == '-')			// Normal
	{
		newcolor = normalcolor;
	}
	else if (newcolor == '+')		// Bold
	{
		newcolor = boldcolor;
	}
	else if (newcolor == '!')		// Team chat
	{
		newcolor = PrintColors[PRINT_TEAMCHAT];
	}
	else if (newcolor == '*')		// Chat
	{
		newcolor = PrintColors[PRINT_CHAT];
	}
	else if (newcolor == '[')		// Named
	{
		const BYTE *namestart = ch;
		while (*ch != ']' && *ch != '\0')
		{
			ch++;
		}
		FName rangename((const char *)namestart, int(ch - namestart), true);
		if (*ch != '\0')
		{
			ch++;
		}
		newcolor = V_FindFontColor (rangename);
	}
	else if (newcolor >= 'A' && newcolor < NUM_TEXT_COLORS + 'A')	// Standard, uppercase
	{
		newcolor -= 'A';
	}
	else if (newcolor >= 'a' && newcolor < NUM_TEXT_COLORS + 'a')	// Standard, lowercase
	{
		newcolor -= 'a';
	}
	else							// Incomplete!
	{
		color_value = ch - (*ch == '\0');
		return CR_UNDEFINED;
	}
	color_value = ch;
	return EColorRange(newcolor);
}